

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O0

void TTD::NSSnapType::EmitSnapPropertyRecord
               (SnapPropertyRecord *sRecord,FileWriter *writer,Separator separator)

{
  Separator separator_local;
  FileWriter *writer_local;
  SnapPropertyRecord *sRecord_local;
  
  (*writer->_vptr_FileWriter[6])(writer,(ulong)separator);
  FileWriter::WriteUInt32(writer,propertyId,sRecord->PropertyId,NoSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,0x54,(ulong)(sRecord->IsNumeric & 1),1);
  (*writer->_vptr_FileWriter[0xc])(writer,0x53,(ulong)(sRecord->IsBound & 1),1);
  (*writer->_vptr_FileWriter[0xc])(writer,0x55,(ulong)(sRecord->IsSymbol & 1),1);
  FileWriter::WriteString(writer,name,&sRecord->PropertyName,CommaSeparator);
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitSnapPropertyRecord(const SnapPropertyRecord* sRecord, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            writer->WriteUInt32(NSTokens::Key::propertyId, sRecord->PropertyId);

            writer->WriteBool(NSTokens::Key::isNumeric, sRecord->IsNumeric, NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::isBound, sRecord->IsBound, NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::isSymbol, sRecord->IsSymbol, NSTokens::Separator::CommaSeparator);

            writer->WriteString(NSTokens::Key::name, sRecord->PropertyName, NSTokens::Separator::CommaSeparator);

            writer->WriteRecordEnd();
        }